

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O0

void __thiscall
mocker::ir::BuilderContext::emplaceGlobalInitInst<mocker::ir::Ret>(BuilderContext *this)

{
  FuncsMap *this_00;
  mapped_type *this_01;
  BasicBlockList *this_02;
  reference this_03;
  shared_ptr<mocker::ir::Ret> local_70;
  shared_ptr<mocker::ir::IRInst> local_60 [2];
  allocator<char> local_39;
  key_type local_38;
  mapped_type *local_18;
  mapped_type *func;
  BuilderContext *this_local;
  
  func = (mapped_type *)this;
  this_00 = Module::getFuncs_abi_cxx11_(&this->module);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"_init_global_vars",&local_39);
  this_01 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>_>
            ::at(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = this_01;
  this_02 = FunctionModule::getMutableBBs_abi_cxx11_(this_01);
  this_03 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
            back(this_02);
  std::make_shared<mocker::ir::Ret>();
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Ret,void>(local_60,&local_70);
  BasicBlock::appendInst(this_03,local_60);
  std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(local_60);
  std::shared_ptr<mocker::ir::Ret>::~shared_ptr(&local_70);
  return;
}

Assistant:

void emplaceGlobalInitInst(Args &&... args) {
    auto &func = module.getFuncs().at("_init_global_vars");
    func.getMutableBBs().back().appendInst(
        std::make_shared<Inst>(std::forward<Args>(args)...));
  }